

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int on_begin_headers(nghttp2_session *session,nghttp2_frame *frame,void *userp)

{
  Curl_easy *data_s;
  HTTP *stream;
  void *userp_local;
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  nghttp2_session_get_stream_user_data(session,(frame->hd).stream_id);
  return 0;
}

Assistant:

static int on_begin_headers(nghttp2_session *session,
                            const nghttp2_frame *frame, void *userp)
{
  struct HTTP *stream;
  struct Curl_easy *data_s = NULL;
  (void)userp;

  data_s = nghttp2_session_get_stream_user_data(session, frame->hd.stream_id);
  if(!data_s) {
    return 0;
  }

  H2BUGF(infof(data_s, "on_begin_headers() was called"));

  if(frame->hd.type != NGHTTP2_HEADERS) {
    return 0;
  }

  stream = data_s->req.p.http;
  if(!stream || !stream->bodystarted) {
    return 0;
  }

  return 0;
}